

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_over_ip.cpp
# Opt level: O0

bool __thiscall
cppcms::impl::cache_over_ip::fetch
          (cache_over_ip *this,string *key,string *a,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,time_t *timeout_out,uint64_t *gen)

{
  int iVar1;
  uint uVar2;
  base_cache *pbVar3;
  tcp_cache *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  string *in_R8;
  string *in_R9;
  int res;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp_triggers;
  uint64_t generation;
  time_t tmp_timeout;
  string buffer;
  undefined4 uVar4;
  cache_over_ip *in_stack_ffffffffffffff00;
  tcp_cache local_a8 [2];
  undefined4 local_78;
  string local_58 [7];
  undefined1 in_stack_ffffffffffffffaf;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  string *local_20;
  bool local_1;
  
  std::__cxx11::string::string(local_58);
  local_20 = in_RDX;
  if (in_RDX == (string *)0x0) {
    local_20 = local_58;
  }
  if (in_R8 == (string *)0x0) {
    in_R8 = (string *)&stack0xffffffffffffffa0;
  }
  if (in_R9 == (string *)0x0) {
    in_R9 = (string *)&stack0xffffffffffffff98;
  }
  pbVar3 = booster::intrusive_ptr<cppcms::impl::base_cache>::get
                     ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI + 0x40));
  if (pbVar3 == (base_cache *)0x0) {
    tcp(in_stack_ffffffffffffff00);
    iVar1 = tcp_cache::fetch(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,
                             (time_t *)in_stack_ffffffffffffffb8,
                             (uint64_t *)in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
    if (iVar1 == 1) {
      local_1 = true;
      local_78 = 1;
    }
    else {
      local_1 = false;
      local_78 = 1;
    }
  }
  else {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x47eea7);
    if (in_RCX == (tcp_cache *)0x0) {
      in_RCX = local_a8;
    }
    pbVar3 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->
                       ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI + 0x40));
    uVar2 = (**pbVar3->_vptr_base_cache)(pbVar3,in_RSI,local_20,in_RCX,in_R8,in_R9);
    if ((uVar2 & 1) == 0) {
      tcp(in_stack_ffffffffffffff00);
      uVar4 = 0;
      iVar1 = tcp_cache::fetch(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,
                               (time_t *)in_stack_ffffffffffffffb8,
                               (uint64_t *)in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf
                              );
      if (iVar1 == 1) {
        pbVar3 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->
                           ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI + 0x40));
        (*pbVar3->_vptr_base_cache[1])
                  (pbVar3,in_RSI,local_20,in_RCX,*(undefined8 *)in_R8,in_R9,uVar4);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      tcp(in_stack_ffffffffffffff00);
      uVar4 = 1;
      iVar1 = tcp_cache::fetch(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,
                               (time_t *)in_stack_ffffffffffffffb8,
                               (uint64_t *)in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf
                              );
      if (iVar1 == -1) {
        local_1 = true;
      }
      else if (iVar1 == 0) {
        pbVar3 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->
                           ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI + 0x40));
        (*pbVar3->_vptr_base_cache[3])(pbVar3,in_RSI);
        local_1 = false;
      }
      else {
        pbVar3 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->
                           ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI + 0x40));
        (*pbVar3->_vptr_base_cache[1])
                  (pbVar3,in_RSI,local_20,in_RCX,*(undefined8 *)in_R8,in_R9,uVar4);
        local_1 = true;
      }
    }
    local_78 = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x47f152);
  }
  std::__cxx11::string::~string(local_58);
  return local_1;
}

Assistant:

bool fetch(	std::string const &key,
				std::string *a,std::set<std::string> *tags,
				time_t *timeout_out,
				uint64_t *gen)
		{
			std::string buffer;
			if(!a) a=&buffer;
			time_t tmp_timeout;
			if(!timeout_out) timeout_out=&tmp_timeout;
			uint64_t generation;
			if(!gen) gen=&generation;

			if(!l1_.get()) {
				if(tcp()->fetch(key,*a,tags,*timeout_out,*gen,false)==tcp_cache::found)
					return true;
				return false;
			}

			std::set<std::string> tmp_triggers;

			if(!tags) tags=&tmp_triggers;
			
			if(l1_->fetch(key,a,tags,timeout_out,gen)) {
				int res = tcp()->fetch(key,*a,tags,*timeout_out,*gen,true);
				if(res==tcp_cache::up_to_date)
					return true;
				if(res==tcp_cache::not_found) {
					l1_->remove(key);
					return false;
				}
				l1_->store(key,*a,*tags,*timeout_out,gen);
				return true;
			}
			else {
				if(tcp()->fetch(key,*a,tags,*timeout_out,*gen,false)==tcp_cache::found) {
					l1_->store(key,*a,*tags,*timeout_out,gen);
					return true;
				}
				return false;
			}
		}